

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

shared_ptr<Promise> createLoopedDelay(void)

{
  pointer p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Impl *this;
  Promise *in_RDI;
  shared_ptr<Promise> *p;
  shared_ptr<Promise> sVar3;
  __allocator_type __a2;
  shared_ptr<Promise> local_c8;
  shared_ptr<Promise> *local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Promise,_std::allocator<Promise>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_90;
  undefined4 local_7c;
  undefined1 local_78 [16];
  code *local_68;
  code *local_60;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  __shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  createLoopedDelay::max = createLoopedDelay::max + -1;
  if (createLoopedDelay::max == 0) {
    puts("DONE LOOP");
    Promise::New();
    Promise::Resolve((Promise *)in_RDI->_vptr_Promise);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    timestamp();
    puts("Creating Looped Delay");
    local_7c = 2000;
    std::make_shared<Delay,int>((int *)&local_58);
    local_c8.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_58;
    local_c8.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         a_Stack_50[0]._M_pi;
    local_58 = (element_type *)0x0;
    a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Promise::Register((Promise *)&local_b0,&local_c8);
    p_Var1 = std::
             allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<Promise,_std::allocator<Promise>,_(__gnu_cxx::_Lock_policy)2>_>_>
             ::allocate(&__a2,1);
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_00108be0;
    this = &p_Var1->_M_impl;
    local_78._0_8_ = (void *)0x0;
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(std::shared_ptr<Promise>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Badrpas[P]es-promise-cpp/test.cpp:15:14)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(std::shared_ptr<Promise>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Badrpas[P]es-promise-cpp/test.cpp:15:14)>
               ::_M_manager;
    local_90._M_alloc = &__a2;
    local_90._M_ptr = p_Var1;
    Promise::Promise((Promise *)this,(ManuallyResolvedHandler *)local_78);
    std::_Function_base::~_Function_base((_Function_base *)local_78);
    local_90._M_ptr = (pointer)0x0;
    local_40._M_ptr = (element_type *)this;
    local_40._M_refcount._M_pi = &p_Var1->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Promise,_std::allocator<Promise>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_90);
    std::__shared_ptr<Promise,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<Promise,Promise>
              ((__shared_ptr<Promise,(__gnu_cxx::_Lock_policy)2> *)&local_40,(Promise *)this);
    std::__shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2> *)local_78,&local_40);
    Promise::Register((Promise *)(local_a8 + 1),(shared_ptr<Promise> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    Promise::Then(in_RDI,local_b0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_c8.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_50);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Promise>)sVar3.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

PromisePtr createLoopedDelay() {
  static int max = 5;
  if (!--max) {
    printf("DONE LOOP\n");
    auto p = Promise::New();
    p->Resolve();
    return p;
  }

  timestamp(); printf("Creating Looped Delay\n");
  return Promise::Register(std::make_shared<Delay>(2000))
      ->Then([](const std::shared_ptr<Promise>& p) {
        timestamp(); printf("Delay Resolved LOOPED\n");
        p->Resolve(createLoopedDelay());
      });
}